

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  MElementType MVar6;
  uint uVar7;
  long lVar8;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar9;
  uint uVar10;
  int64_t size;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  TPZFMatrix<double> *pTVar16;
  int iVar17;
  long lVar18;
  REAL detjac;
  TPZManVector<int,_3> ord;
  TPZGeoElSide gelside;
  TPZManVector<int,_9> permutegather;
  TPZManVector<long,_8> id;
  TPZManVector<long,_28> FirstIndex;
  REAL local_948;
  ulong local_940;
  TPZVec<double> *local_938;
  TPZFMatrix<double> *local_930;
  long local_928;
  TPZFMatrix<double> *local_920;
  ulong local_918;
  TPZVec<int> local_910;
  uint local_8f0;
  uint local_8ec;
  uint local_8e8;
  TPZGeoElSide local_8e0;
  TPZManVector<int,_9> local_8c8;
  TPZManVector<long,_8> local_880;
  TPZFMatrix<double> local_820;
  double local_790 [10];
  TPZManVector<long,_28> local_740;
  TPZFMatrix<double> local_640;
  double local_5b0 [10];
  TPZFMatrix<double> local_560;
  double local_4d0 [10];
  TPZFMatrix<double> local_480;
  double local_3f0 [51];
  TPZFMatrix<double> local_258;
  double local_1c8 [51];
  
  local_930 = dphi;
  local_920 = phi;
  if ((side == 3) || (point->fNElements != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Don\'t have side shape associated to this side",0x2d);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x1cf);
  }
  iVar2 = pztopology::TPZLine::SideDimension(side);
  if (iVar2 == 0) {
    iVar2 = pztopology::TPZLine::NContainedSides(side);
    iVar17 = 0;
    uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x250))(this,0,side);
    lVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar3);
    uVar10 = (uint)*(byte *)(lVar8 + 0x14);
    if (0 < iVar2) {
      iVar17 = 0;
      iVar12 = 0;
      do {
        iVar4 = pztopology::TPZLine::ContainedSideLocId(side,iVar12);
        iVar4 = pzshape::TPZShapeLinear::NConnectShapeF(iVar4,uVar10);
        iVar17 = iVar17 + iVar4;
        iVar12 = iVar12 + 1;
      } while (iVar2 != iVar12);
    }
    this_00 = TPZCompEl::Reference((TPZCompEl *)this);
    uVar5 = pztopology::TPZLine::NSideNodes(side);
    TPZManVector<long,_8>::TPZManVector(&local_880,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        iVar12 = pztopology::TPZLine::SideNodeLocId(side,(int)uVar13);
        pTVar9 = TPZGeoEl::Node(this_00,iVar12);
        local_880.super_TPZVec<long>.fStore[uVar13] = (long)pTVar9->fId;
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    TPZManVector<int,_9>::TPZManVector(&local_8c8,(long)iVar2);
    MVar6 = pztopology::TPZLine::Type(side);
    local_938 = point;
    if (MVar6 == EOned) {
      iVar2 = pztopology::TPZLine::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    else if (MVar6 == ETriangle) {
      iVar2 = pztopology::TPZTriangle::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZTriangle::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    else {
      if (MVar6 != EQuadrilateral) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x200);
      }
      iVar2 = pztopology::TPZQuadrilateral::GetTransformId(&local_880.super_TPZVec<long>);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar2,&local_8c8.super_TPZVec<int>);
    }
    TPZVec<int>::TPZVec(&local_910,0);
    local_928 = CONCAT44(local_928._4_4_,MVar6);
    local_910.fStore = (int *)&local_8f0;
    local_910._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
    local_910.fNElements = 3;
    local_910.fNAlloc = 0;
    local_8f0 = uVar10;
    local_8ec = uVar10;
    local_8e8 = uVar10;
    uVar5 = pztopology::TPZLine::SideDimension(side);
    lVar8 = (long)iVar17;
    local_258.fElem = local_1c8;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018b95f0;
    local_258.fSize = 0x32;
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_258.fGiven = local_258.fElem;
    TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
    local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
    local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_258.fPivot.super_TPZVec<int>.fNElements = 0;
    local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_258.fWork.fStore = (double *)0x0;
    local_258.fWork.fNElements = 0;
    local_258.fWork.fNAlloc = 0;
    if (iVar17 == 0) {
      local_258.fElem = (double *)0x0;
    }
    else if (0x32 < iVar17) {
      local_258.fElem = (double *)operator_new__(lVar8 * 8);
    }
    local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018b9300;
    local_480.fElem = local_3f0;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018b95f0;
    local_480.fSize = 0x32;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)uVar5;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_480.fGiven = local_480.fElem;
    TPZVec<int>::TPZVec(&local_480.fPivot.super_TPZVec<int>,0);
    local_480.fPivot.super_TPZVec<int>.fStore = local_480.fPivot.fExtAlloc;
    local_480.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_480.fPivot.super_TPZVec<int>.fNElements = 0;
    local_480.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_480.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_480.fWork.fStore = (double *)0x0;
    local_480.fWork.fNElements = 0;
    local_480.fWork.fNAlloc = 0;
    uVar13 = (int)uVar5 * lVar8;
    if (uVar13 == 0) {
      local_480.fElem = (double *)0x0;
    }
    else if (0x32 < (long)uVar13) {
      local_480.fElem = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018b9300;
    pzshape::TPZShapeLinear::SideShape
              (side,local_938,&local_880.super_TPZVec<long>,&local_910,&local_258,&local_480);
    uVar7 = pztopology::TPZLine::NContainedSides(side);
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZManVector<long,_28>::TPZManVector(&local_740,(long)(int)(uVar7 + 1),(long *)&local_820);
    local_918 = (ulong)uVar7;
    local_940 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      uVar13 = 0;
      do {
        iVar2 = pztopology::TPZLine::ContainedSideLocId(side,(int)uVar13);
        lVar8 = local_740.super_TPZVec<long>.fStore[uVar13];
        iVar2 = pzshape::TPZShapeLinear::NConnectShapeF(iVar2,uVar10);
        local_740.super_TPZVec<long>.fStore[uVar13 + 1] = lVar8 + iVar2;
        uVar13 = uVar13 + 1;
      } while (local_918 != uVar13);
    }
    local_948 = 1.0;
    local_8e0.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
    local_8e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_8e0.fSide = side;
    iVar2 = (**(code **)(*(long *)this_00 + 0x208))();
    lVar8 = (long)iVar2;
    local_820.fElem = local_790;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816238;
    local_820.fSize = 9;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_820.fGiven = local_820.fElem;
    TPZVec<int>::TPZVec(&local_820.fPivot.super_TPZVec<int>,0);
    local_820.fPivot.super_TPZVec<int>.fStore = local_820.fPivot.fExtAlloc;
    local_820.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_820.fPivot.super_TPZVec<int>.fNElements = 0;
    local_820.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_820.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_820.fWork.fStore = (double *)0x0;
    local_820.fWork.fNElements = 0;
    local_820.fWork.fNAlloc = 0;
    uVar13 = lVar8 * lVar8;
    if (iVar2 == 0) {
      local_820.fElem = (double *)0x0;
    }
    else if (9 < uVar13) {
      local_820.fElem = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    local_820.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01815f48;
    local_640.fElem = local_5b0;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816238;
    local_640.fSize = 9;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_640.fGiven = local_640.fElem;
    TPZVec<int>::TPZVec(&local_640.fPivot.super_TPZVec<int>,0);
    local_640.fPivot.super_TPZVec<int>.fStore = local_640.fPivot.fExtAlloc;
    local_640.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_640.fPivot.super_TPZVec<int>.fNElements = 0;
    local_640.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_640.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_640.fWork.fStore = (double *)0x0;
    local_640.fWork.fNElements = 0;
    local_640.fWork.fNAlloc = 0;
    if (iVar2 == 0) {
      local_640.fElem = (double *)0x0;
    }
    else if (9 < uVar13) {
      local_640.fElem = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    }
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01815f48;
    local_560.fElem = local_4d0;
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816238;
    local_560.fSize = 9;
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_560.fGiven = local_560.fElem;
    TPZVec<int>::TPZVec(&local_560.fPivot.super_TPZVec<int>,0);
    pTVar16 = local_920;
    local_560.fPivot.super_TPZVec<int>.fStore = local_560.fPivot.fExtAlloc;
    local_560.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_560.fPivot.super_TPZVec<int>.fNElements = 0;
    local_560.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_560.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_560.fWork.fStore = (double *)0x0;
    local_560.fWork.fNElements = 0;
    local_560.fWork.fNAlloc = 0;
    if (iVar2 == 0) {
      local_560.fElem = (double *)0x0;
    }
    else if (3 < iVar2) {
      local_560.fElem = (double *)operator_new__(lVar8 * 0x18);
    }
    local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01815f48;
    TPZGeoElSide::Jacobian(&local_8e0,local_938,&local_820,&local_560,&local_948,&local_640);
    TPZFMatrix<double>::~TPZFMatrix(&local_560,&PTR_PTR_01816200);
    TPZFMatrix<double>::~TPZFMatrix(&local_640,&PTR_PTR_01816200);
    TPZFMatrix<double>::~TPZFMatrix(&local_820,&PTR_PTR_01816200);
    if ((int)local_928 == 2) {
      local_948 = local_948 / 6.0;
    }
    if (0 < (int)local_940) {
      uVar13 = 0;
      do {
        local_940 = uVar13;
        uVar10 = (int)local_740.super_TPZVec<long>.fStore[local_940 + 1] -
                 (int)local_740.super_TPZVec<long>.fStore[local_940];
        if (0 < (int)uVar10) {
          local_938 = (TPZVec<double> *)
                      (long)(int)local_740.super_TPZVec<long>.fStore
                                 [local_8c8.super_TPZVec<int>.fStore[local_940]];
          local_928 = (long)(int)local_740.super_TPZVec<long>.fStore[local_940];
          lVar8 = (long)local_938 * 8;
          lVar11 = local_928 * 8;
          uVar13 = 0;
          do {
            lVar18 = (long)&local_938->_vptr_TPZVec + uVar13;
            if (((lVar18 < 0) ||
                (local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18)) ||
               (local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar14 = uVar13 + local_928;
            if (((lVar14 < 0) ||
                ((pTVar16->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14)) ||
               ((pTVar16->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pTVar16->fElem[lVar14] = local_258.fElem[lVar18] / local_948;
            if (0 < (int)uVar5) {
              uVar15 = 0;
              do {
                if (((local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar15) ||
                    (lVar18 < 0)) ||
                   (local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar1 = (local_930->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                if (((lVar1 <= (long)uVar15) || (lVar14 < 0)) ||
                   ((local_930->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)((long)local_930->fElem + uVar15 * 8 + lVar1 * lVar11) =
                     *(double *)
                      ((long)local_480.fElem +
                      uVar15 * 8 +
                      local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8) /
                     local_948;
                uVar15 = uVar15 + 1;
              } while (uVar5 != uVar15);
            }
            uVar13 = uVar13 + 1;
            lVar8 = lVar8 + 8;
            lVar11 = lVar11 + 8;
            pTVar16 = local_920;
          } while (uVar13 != (uVar10 & 0x7fffffff));
        }
        uVar13 = local_940 + 1;
      } while (local_940 + 1 != local_918);
    }
    if (local_740.super_TPZVec<long>.fStore != local_740.fExtAlloc) {
      local_740.super_TPZVec<long>.fNAlloc = 0;
      local_740.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_740.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_740.super_TPZVec<long>.fStore);
      }
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_480,&PTR_PTR_018b95b8);
    TPZFMatrix<double>::~TPZFMatrix(&local_258,&PTR_PTR_018b95b8);
    if ((uint *)local_910.fStore != &local_8f0) {
      local_910.fNAlloc = 0;
      local_910._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if ((uint *)local_910.fStore != (uint *)0x0) {
        operator_delete__(local_910.fStore);
      }
    }
    if (local_8c8.super_TPZVec<int>.fStore != local_8c8.fExtAlloc) {
      local_8c8.super_TPZVec<int>.fNAlloc = 0;
      local_8c8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_8c8.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_8c8.super_TPZVec<int>.fStore);
      }
    }
    if (local_880.super_TPZVec<long>.fStore != local_880.fExtAlloc) {
      local_880.super_TPZVec<long>.fNAlloc = 0;
      local_880.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_880.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_880.super_TPZVec<long>.fStore);
      }
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}